

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_set_s(OpenJTalk *oj,uint i)

{
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  oj->errorCode = OPENJTALKERROR_NO_ERROR;
  if (i != 0) {
    oj->sampling_frequency = (ulong)i;
    Open_JTalk_set_sampling_frequency(oj->open_jtalk,(ulong)i);
    return;
  }
  oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setSamplingFrequency(OpenJTalk *oj, unsigned int i)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (i < 1)
	{
		oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
		return;
	}
	oj->sampling_frequency = i;
	Open_JTalk_set_sampling_frequency(oj->open_jtalk, oj->sampling_frequency);
}